

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::ProcessValidTx
          (PeerManagerImpl *this,NodeId nodeid,CTransactionRef *tx,
          list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *replaced_transactions)

{
  long lVar1;
  element_type *peVar2;
  string_view source_file;
  bool bVar3;
  size_t sVar4;
  Logger *pLVar5;
  const_iterator __end1;
  Wtxid *wtxid;
  _List_node_base *p_Var6;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  unsigned_long *in_stack_fffffffffffffec0;
  ulong local_128;
  undefined1 local_120 [8];
  NodeId nodeid_local;
  string local_108;
  string local_e8 [4];
  string local_68;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nodeid_local = nodeid;
  TxRequestTracker::ForgetTxHash
            (&this->m_txrequest,
             &(((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              hash).m_wrapped);
  TxRequestTracker::ForgetTxHash
            (&this->m_txrequest,
             &(((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              m_witness_hash).m_wrapped);
  TxOrphanage::AddChildrenToWorkSet
            (&this->m_orphanage,
             (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  wtxid = &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           m_witness_hash;
  TxOrphanage::EraseTx(&this->m_orphanage,wtxid);
  bVar3 = ::LogAcceptCategory(MEMPOOL,(Level)wtxid);
  if (bVar3) {
    base_blob<256u>::ToString_abi_cxx11_
              (local_e8,(base_blob<256u> *)
                        &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_108,
               (base_blob<256u> *)
               &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    local_120 = (undefined1  [8])CTxMemPool::size(this->m_mempool);
    sVar4 = CTxMemPool::DynamicMemoryUsage(this->m_mempool);
    local_128 = sVar4 / 1000;
    pLVar5 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar5);
    if (bVar3) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<long,std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
                (&local_68,
                 (tinyformat *)
                 "AcceptToMemoryPool: peer=%d: accepted %s (wtxid=%s) (poolsz %u txn, %u kB)\n",
                 (char *)&nodeid_local,(long *)local_e8,&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 &local_128,in_stack_fffffffffffffec0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      pLVar5 = LogInstance();
      local_68._M_dataplus._M_p = (pointer)0x5b;
      local_68._M_string_length = 0x69e0a1;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
      ;
      source_file._M_len = 0x5b;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "ProcessValidTx";
      logging_function._M_len = 0xe;
      BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0xce0,MEMPOOL,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)local_e8);
  }
  peVar2 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  RelayTransaction(this,&(peVar2->hash).m_wrapped,&(peVar2->m_witness_hash).m_wrapped);
  p_Var6 = (_List_node_base *)replaced_transactions;
  while (p_Var6 = (((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)replaced_transactions) {
    AddToCompactExtraTransactions(this,(CTransactionRef *)(p_Var6 + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessValidTx(NodeId nodeid, const CTransactionRef& tx, const std::list<CTransactionRef>& replaced_transactions)
{
    AssertLockNotHeld(m_peer_mutex);
    AssertLockHeld(g_msgproc_mutex);
    AssertLockHeld(m_tx_download_mutex);

    // As this version of the transaction was acceptable, we can forget about any requests for it.
    // No-op if the tx is not in txrequest.
    m_txrequest.ForgetTxHash(tx->GetHash());
    m_txrequest.ForgetTxHash(tx->GetWitnessHash());

    m_orphanage.AddChildrenToWorkSet(*tx);
    // If it came from the orphanage, remove it. No-op if the tx is not in txorphanage.
    m_orphanage.EraseTx(tx->GetWitnessHash());

    LogDebug(BCLog::MEMPOOL, "AcceptToMemoryPool: peer=%d: accepted %s (wtxid=%s) (poolsz %u txn, %u kB)\n",
             nodeid,
             tx->GetHash().ToString(),
             tx->GetWitnessHash().ToString(),
             m_mempool.size(), m_mempool.DynamicMemoryUsage() / 1000);

    RelayTransaction(tx->GetHash(), tx->GetWitnessHash());

    for (const CTransactionRef& removedTx : replaced_transactions) {
        AddToCompactExtraTransactions(removedTx);
    }
}